

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgt.cpp
# Opt level: O1

bool ReadMGT(MemFile *file,shared_ptr<Disk> *disk)

{
  ushort uVar1;
  uchar *__src;
  ushort *puVar2;
  Disk *this;
  element_type *peVar3;
  char extraout_AL;
  bool bVar4;
  bool bVar5;
  int iVar6;
  string *path;
  Data *data;
  char *pcVar7;
  uint offset;
  FILE *pFVar8;
  MGT_DISK_INFO di;
  array<unsigned_char,_512UL> sector0;
  undefined1 local_2c0 [36];
  uint uStack_29c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  char *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  undefined4 local_278;
  Format local_26c;
  uint8_t local_230 [512];
  
  pFVar8 = (FILE *)disk;
  iVar6 = MemFile::size(file);
  if (((iVar6 == 0xc8000) && (MemFile::rewind(file,pFVar8), extraout_AL != '\0')) &&
     (iVar6 = MemFile::remaining(file), 0x1ff < iVar6)) {
    __src = (file->m_it)._M_current;
    memcpy(local_230,__src,0x200);
    (file->m_it)._M_current = __src + 0x200;
    local_298 = &local_288;
    stack0xfffffffffffffd60 = (char *)0x400000000;
    local_290 = (char *)0x0;
    local_288._M_local_buf[0] = '\0';
    local_278 = 0;
    GetDiskInfo(local_230,(MGT_DISK_INFO *)(local_2c0 + 0x20));
    bVar4 = MemFile::seek(file,uStack_29c * 0x2800 + 0x1fe);
    if (bVar4) {
      iVar6 = MemFile::remaining(file);
      if (iVar6 < 2) {
        bVar4 = false;
      }
      else {
        puVar2 = (ushort *)(file->m_it)._M_current;
        uVar1 = *puVar2;
        (file->m_it)._M_current = (uchar *)(puVar2 + 1);
        bVar4 = (char)(uVar1 >> 8) == '\x02' && uStack_29c == (uVar1 & 0xff);
      }
    }
    else {
      bVar4 = false;
    }
    offset = uStack_29c * 0x1400 + 0x1fe;
    pFVar8 = (FILE *)(ulong)offset;
    bVar5 = MemFile::seek(file,offset);
    if ((bVar5) && (iVar6 = MemFile::remaining(file), 1 < iVar6)) {
      puVar2 = (ushort *)(file->m_it)._M_current;
      uVar1 = *puVar2;
      (file->m_it)._M_current = (uchar *)(puVar2 + 1);
      bVar5 = (char)(uVar1 >> 8) == '\x02' && uStack_29c == (uVar1 & 0xff);
    }
    else {
      bVar5 = false;
    }
    if (bVar4 || bVar5 != false) {
      bVar4 = false;
    }
    else {
      path = MemFile::name_abi_cxx11_(file);
      local_2c0._0_8_ = local_2c0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"mgt","");
      pFVar8 = (FILE *)local_2c0;
      bVar4 = IsFileExt(path,(string *)pFVar8);
      bVar4 = !bVar4;
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        pFVar8 = (FILE *)(local_2c0._16_8_ + 1);
        operator_delete((void *)local_2c0._0_8_,(ulong)pFVar8);
      }
    }
    if (bVar4 == false) {
      MemFile::rewind(file,pFVar8);
      this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      Format::Format(&local_26c,MGT);
      data = MemFile::data(file);
      Disk::format(this,&local_26c,data,bVar5);
      pcVar7 = "MGT";
      if (bVar5 != false) {
        pcVar7 = "IMG";
      }
      peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::_M_replace
                ((ulong)&peVar3->strType,0,(char *)(peVar3->strType)._M_string_length,(ulong)pcVar7)
      ;
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    bVar4 = (bool)(bVar4 ^ 1);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ReadMGT(MemFile& file, std::shared_ptr<Disk>& disk)
{
    if (file.size() != MGT_DISK_SIZE)
        return false;

    // Read the first sector, which contains disk information.
    std::array<uint8_t, SECTOR_SIZE> sector0;
    if (!file.rewind() || !file.read(sector0))
        return false;

    MGT_DISK_INFO di{};
    GetDiskInfo(sector0.data(), di);

    // Check the expected chain offset in MGT images (alternating sides).
    std::array<uint8_t, 2> buf;
    auto offset = (di.dir_tracks * MGT_SIDES * MGT_TRACK_SIZE) + SECTOR_SIZE - 2;
    bool mgt = file.seek(offset) && file.read(buf) && buf[0] == di.dir_tracks && buf[1] == 2;

    // Check the expected chain offset in IMG images (side 0 then side 1).
    offset = (di.dir_tracks * MGT_TRACK_SIZE) + SECTOR_SIZE - 2;
    bool img = file.seek(offset) && file.read(buf) && buf[0] == di.dir_tracks && buf[1] == 2;

    // If neither signature matched this probably isn't an MGT file.
    // However, accept it if it has a .mgt file extension.
    if (!mgt && !img && !IsFileExt(file.name(), "mgt"))
        return false;

    file.rewind();
    disk->format(Format(RegularFormat::MGT), file.data(), img);
    disk->strType = img ? "IMG" : "MGT";

    return true;
}